

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  SecondaryInstanceWidget *this;
  Object local_58 [8];
  KDSingleApplication kdsa;
  int argc_local;
  code *local_30;
  undefined8 uStack_28;
  QApplication app;
  
  argc_local = argc;
  QApplication::QApplication(&app,&argc_local,argv,0x60204);
  KDSingleApplication::KDSingleApplication(&kdsa,(QObject *)0x0);
  cVar1 = KDSingleApplication::isPrimaryInstance();
  if (cVar1 == '\0') {
    this = (SecondaryInstanceWidget *)operator_new(0x38);
    SecondaryInstanceWidget::SecondaryInstanceWidget(this,&kdsa,(QWidget *)0x0);
  }
  else {
    this = (SecondaryInstanceWidget *)operator_new(0x30);
    PrimaryInstanceWidget::PrimaryInstanceWidget((PrimaryInstanceWidget *)this,(QWidget *)0x0);
    local_30 = PrimaryInstanceWidget::addMessage;
    uStack_28 = 0;
    QObject::
    connect<void(KDSingleApplication::*)(QByteArray_const&),void(PrimaryInstanceWidget::*)(QByteArray_const&)>
              (local_58,(offset_in_KDSingleApplication_to_subr)&kdsa,
               (Object *)KDSingleApplication::messageReceived,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_58);
  }
  QWidget::setAttribute((WidgetAttribute)this,true);
  QWidget::show();
  iVar2 = QApplication::exec();
  KDSingleApplication::~KDSingleApplication(&kdsa);
  QApplication::~QApplication(&app);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDSingleApplication kdsa;

    QWidget *widget;

    if (kdsa.isPrimaryInstance()) {
        PrimaryInstanceWidget *piw = new PrimaryInstanceWidget;
        QObject::connect(&kdsa, &KDSingleApplication::messageReceived,
                         piw, &PrimaryInstanceWidget::addMessage);

        widget = piw;
    } else {
        SecondaryInstanceWidget *siw = new SecondaryInstanceWidget(&kdsa);
        widget = siw;
    }

    widget->setAttribute(Qt::WA_DeleteOnClose);
    widget->show();

    return app.exec();
}